

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

void mkdir_prefix(char *path,int mode)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = strrchr(path,0x2f);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
    iVar1 = is_directory(path);
    if (iVar1 == 0) {
      iVar1 = mkdir(path,mode);
      if (iVar1 != 0) {
        mkdir_prefix(path,mode);
        mkdir(path,mode);
      }
      chmod(path,mode);
    }
    *pcVar2 = '/';
  }
  return;
}

Assistant:

void mkdir_prefix(char *path, int mode) {
    char *cp = strrchr(path, '/');
    if (!cp)
	return;

    *cp = 0;
    if (is_directory(path)) {
	*cp = '/';
	return;
    }

    if (mkdir(path, mode) == 0) {
	chmod(path, mode);
	*cp = '/';
	return;
    }

    mkdir_prefix(path, mode);
    mkdir(path, mode);
    chmod(path, mode);
    *cp = '/';
}